

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int iVar2;
  xmlChar **ppxVar3;
  int newSize;
  xmlChar **n;
  int local_40;
  int i;
  int maxatts;
  int nbatts;
  xmlChar **atts;
  xmlChar *attvalue;
  xmlChar *attname;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  _maxatts = ctxt->atts;
  i = 0;
  local_40 = ctxt->maxatts;
  if (*ctxt->input->cur == '<') {
    ctxt->input->col = ctxt->input->col + 1;
    ctxt->input->cur = ctxt->input->cur + 1;
    name = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    attname = xmlParseName((xmlParserCtxtPtr)name);
    if (attname == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                     "xmlParseStartTag: invalid element name\n");
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      xmlSkipBlankChars((xmlParserCtxtPtr)name);
      if (((*(uint *)(*(long *)(name + 0x38) + 0x60) & 0x40) == 0) &&
         (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) < 0xfa
         )) {
        xmlParserGrow((xmlParserCtxtPtr)name);
      }
      while( true ) {
        bVar1 = false;
        if (((**(char **)(*(long *)(name + 0x38) + 0x20) != '>') &&
            ((**(char **)(*(long *)(name + 0x38) + 0x20) != '/' ||
             (bVar1 = false, *(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) != '>')))) &&
           (((8 < **(byte **)(*(long *)(name + 0x38) + 0x20) &&
             (**(byte **)(*(long *)(name + 0x38) + 0x20) < 0xb)) ||
            ((**(char **)(*(long *)(name + 0x38) + 0x20) == '\r' ||
             (bVar1 = false, 0x1f < **(byte **)(*(long *)(name + 0x38) + 0x20))))))) {
          bVar1 = *(int *)(name + 0x14c) < 2;
        }
        if ((!bVar1) ||
           (attvalue = xmlParseAttribute((xmlParserCtxtPtr)name,(xmlChar **)&atts),
           attvalue == (xmlChar *)0x0)) break;
        if (atts != (xmlChar **)0x0) {
          for (n._4_4_ = 0; n._4_4_ < i; n._4_4_ = n._4_4_ + 2) {
            iVar2 = xmlStrEqual(_maxatts[n._4_4_],attvalue);
            if (iVar2 != 0) {
              xmlErrAttributeDup((xmlParserCtxtPtr)name,(xmlChar *)0x0,attvalue);
              goto LAB_00149276;
            }
          }
          if (local_40 < i + 4) {
            iVar2 = xmlGrowCapacity(local_40,0x10,0xb,100000000);
            if (iVar2 < 0) {
              xmlErrMemory((xmlParserCtxtPtr)name);
            }
            else {
              ppxVar3 = (xmlChar **)(*xmlRealloc)(_maxatts,(long)iVar2 << 4);
              if (ppxVar3 != (xmlChar **)0x0) {
                local_40 = iVar2 << 1;
                *(xmlChar ***)(name + 0x1d0) = ppxVar3;
                *(int *)(name + 0x1d8) = local_40;
                _maxatts = ppxVar3;
                goto LAB_00149213;
              }
              xmlErrMemory((xmlParserCtxtPtr)name);
            }
          }
          else {
LAB_00149213:
            _maxatts[i] = attvalue;
            _maxatts[i + 1] = (xmlChar *)atts;
            _maxatts[i + 2] = (xmlChar *)0x0;
            _maxatts[i + 3] = (xmlChar *)0x0;
            atts = (xmlChar **)0x0;
            i = i + 2;
          }
        }
LAB_00149276:
        if (atts != (xmlChar **)0x0) {
          (*xmlFree)(atts);
        }
        if (((*(uint *)(*(long *)(name + 0x38) + 0x60) & 0x40) == 0) &&
           (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) <
            0xfa)) {
          xmlParserGrow((xmlParserCtxtPtr)name);
        }
        if ((**(char **)(*(long *)(name + 0x38) + 0x20) == '>') ||
           ((**(char **)(*(long *)(name + 0x38) + 0x20) == '/' &&
            (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == '>')))) break;
        iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
        if (iVar2 == 0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                         "attributes construct error\n");
        }
        if ((*(uint *)(*(long *)(name + 0x38) + 0x60) & 0x40) == 0) {
          xmlParserShrink((xmlParserCtxtPtr)name);
        }
        if (((*(uint *)(*(long *)(name + 0x38) + 0x60) & 0x40) == 0) &&
           (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) <
            0xfa)) {
          xmlParserGrow((xmlParserCtxtPtr)name);
        }
      }
      if ((*(long *)name != 0) &&
         ((*(long *)(*(long *)name + 0x70) != 0 && (*(int *)(name + 0x14c) == 0)))) {
        if (i < 1) {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,0);
        }
        else {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,_maxatts);
        }
      }
      if (_maxatts != (xmlChar **)0x0) {
        for (n._4_4_ = 1; n._4_4_ < i; n._4_4_ = n._4_4_ + 2) {
          if (_maxatts[n._4_4_] != (xmlChar *)0x0) {
            (*xmlFree)(_maxatts[n._4_4_]);
          }
        }
      }
      ctxt_local = (xmlParserCtxtPtr)attname;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (PARSER_STOPPED(ctxt) == 0)) {
	attname = xmlParseAttribute(ctxt, &attvalue);
        if (attname == NULL)
	    break;
        if (attvalue != NULL) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (nbatts + 4 > maxatts) {
	        const xmlChar **n;
                int newSize;

                newSize = xmlGrowCapacity(maxatts, sizeof(n[0]) * 2,
                                          11, XML_MAX_ATTRS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                if (newSize < 2)
                    newSize = 2;
#endif
	        n = xmlRealloc(atts, newSize * sizeof(n[0]) * 2);
		if (n == NULL) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
		atts = n;
                maxatts = newSize * 2;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }

	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;

            attvalue = NULL;
	}

failed:

        if (attvalue != NULL)
            xmlFree(attvalue);

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}